

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall crnlib::crn_comp::create_comp_data(crn_comp *this)

{
  vector<unsigned_char> *this_00;
  uint uVar1;
  crn_comp_params *pcVar2;
  crn_packed_uint<2U> *this_01;
  uint16 uVar3;
  uint i_1;
  vector<unsigned_char> *b;
  uint i;
  ulong uVar4;
  uint val;
  crn_packed_uint<4U> *this_02;
  uint level_ofs [16];
  
  *(undefined8 *)((this->m_crn_header).m_alpha_selectors.m_ofs.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_tables_size.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_selectors.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_alpha_endpoints.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_userdata1.m_buf + 3) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_endpoints.m_num.m_buf + 1) = 0;
  (this->m_crn_header).m_levels = (uchar  [1])0x0;
  (this->m_crn_header).m_faces = (uchar  [1])0x0;
  (this->m_crn_header).m_format = (uchar  [1])0x0;
  (this->m_crn_header).m_flags = (uchar  [2])0x0;
  (this->m_crn_header).m_reserved.m_buf[0] = '\0';
  (this->m_crn_header).m_reserved.m_buf[1] = '\0';
  (this->m_crn_header).m_reserved.m_buf[2] = '\0';
  *(undefined8 *)((this->m_crn_header).m_reserved.m_buf + 3) = 0;
  (this->m_crn_header).m_sig = (uchar  [2])0x0;
  (this->m_crn_header).m_header_size = (uchar  [2])0x0;
  (this->m_crn_header).m_header_crc16 = (uchar  [2])0x0;
  (this->m_crn_header).m_data_size.m_buf[0] = '\0';
  (this->m_crn_header).m_data_size.m_buf[1] = '\0';
  *(undefined8 *)((this->m_crn_header).m_data_size.m_buf + 2) = 0;
  crnd::crn_packed_uint<2U>::operator=
            (&(this->m_crn_header).m_width,(uint)(ushort)this->m_pParams->m_width);
  crnd::crn_packed_uint<2U>::operator=
            (&(this->m_crn_header).m_height,(uint)(ushort)this->m_pParams->m_height);
  pcVar2 = this->m_pParams;
  (this->m_crn_header).m_levels.m_buf[0] = (uchar)pcVar2->m_levels;
  (this->m_crn_header).m_faces.m_buf[0] = (uchar)pcVar2->m_faces;
  (this->m_crn_header).m_format.m_buf[0] = (char)pcVar2->m_format;
  crnd::crn_packed_uint<4U>::operator=(&(this->m_crn_header).m_userdata0,pcVar2->m_userdata0);
  crnd::crn_packed_uint<4U>::operator=
            (&(this->m_crn_header).m_userdata1,this->m_pParams->m_userdata1);
  this_00 = &this->m_comp_data;
  vector<unsigned_char>::clear(this_00);
  vector<unsigned_char>::reserve(this_00,0x200000);
  append_vec(this_00,&this->m_crn_header,0x4a);
  vector<unsigned_char>::resize
            (this_00,((this->m_comp_data).m_size + this->m_pParams->m_levels * 4) - 4,false);
  if ((this->m_packed_color_endpoints).m_size != 0) {
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_color_endpoints.m_num,
               (uint)(ushort)(this->m_color_endpoints).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_color_endpoints.m_size,
               (this->m_packed_color_endpoints).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_color_endpoints.m_ofs,(this->m_comp_data).m_size);
    append_vec(this_00,&this->m_packed_color_endpoints);
  }
  if ((this->m_packed_color_selectors).m_size != 0) {
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_color_selectors.m_num,
               (uint)(ushort)(this->m_color_selectors).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_color_selectors.m_size,
               (this->m_packed_color_selectors).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_color_selectors.m_ofs,(this->m_comp_data).m_size);
    append_vec(this_00,&this->m_packed_color_selectors);
  }
  if ((this->m_packed_alpha_endpoints).m_size != 0) {
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_alpha_endpoints.m_num,
               (uint)(ushort)(this->m_alpha_endpoints).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_alpha_endpoints.m_size,
               (this->m_packed_alpha_endpoints).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_alpha_endpoints.m_ofs,(this->m_comp_data).m_size);
    append_vec(this_00,&this->m_packed_alpha_endpoints);
  }
  if ((this->m_packed_alpha_selectors).m_size != 0) {
    crnd::crn_packed_uint<2U>::operator=
              (&(this->m_crn_header).m_alpha_selectors.m_num,
               (uint)(ushort)(this->m_alpha_selectors).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_alpha_selectors.m_size,
               (this->m_packed_alpha_selectors).m_size);
    crnd::crn_packed_uint<3U>::operator=
              (&(this->m_crn_header).m_alpha_selectors.m_ofs,(this->m_comp_data).m_size);
    append_vec(this_00,&this->m_packed_alpha_selectors);
  }
  crnd::crn_packed_uint<3U>::operator=
            (&(this->m_crn_header).m_tables_ofs,(this->m_comp_data).m_size);
  crnd::crn_packed_uint<2U>::operator=
            (&(this->m_crn_header).m_tables_size,(this->m_packed_data_models).m_size);
  append_vec(this_00,&this->m_packed_data_models);
  b = this->m_packed_blocks;
  for (uVar4 = 0; uVar4 < (this->m_levels).m_size; uVar4 = uVar4 + 1) {
    level_ofs[uVar4] = (this->m_comp_data).m_size;
    append_vec(this_00,b);
    b = b + 1;
  }
  this_01 = (crn_packed_uint<2U> *)this_00->m_p;
  memcpy(this_01,&this->m_crn_header,0x4a);
  this_02 = (crn_packed_uint<4U> *)(this_01 + 0x23);
  for (uVar4 = 0; uVar1 = (this->m_levels).m_size, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    crnd::crn_packed_uint<4U>::operator=(this_02,level_ofs[uVar4]);
    this_02 = this_02 + 1;
  }
  val = uVar1 * 4 + 0x46;
  crnd::crn_packed_uint<2U>::operator=(this_01,0x4878);
  crnd::crn_packed_uint<4U>::operator=
            ((crn_packed_uint<4U> *)(this_01 + 3),(this->m_comp_data).m_size);
  uVar3 = crc16((this->m_comp_data).m_p + val,(ulong)((this->m_comp_data).m_size - val),0);
  crnd::crn_packed_uint<2U>::operator=(this_01 + 5,(uint)uVar3);
  crnd::crn_packed_uint<2U>::operator=(this_01 + 1,val);
  uVar3 = crc16((crn_packed_uint<4U> *)(this_01 + 3),(ulong)(uVar1 * 4 + 0x40),0);
  crnd::crn_packed_uint<2U>::operator=(this_01 + 2,(uint)uVar3);
  return true;
}

Assistant:

bool crn_comp::create_comp_data() {
  utils::zero_object(m_crn_header);

  m_crn_header.m_width = static_cast<uint16>(m_pParams->m_width);
  m_crn_header.m_height = static_cast<uint16>(m_pParams->m_height);
  m_crn_header.m_levels = static_cast<uint8>(m_pParams->m_levels);
  m_crn_header.m_faces = static_cast<uint8>(m_pParams->m_faces);
  m_crn_header.m_format = static_cast<uint8>(m_pParams->m_format);
  m_crn_header.m_userdata0 = m_pParams->m_userdata0;
  m_crn_header.m_userdata1 = m_pParams->m_userdata1;

  m_comp_data.clear();
  m_comp_data.reserve(2 * 1024 * 1024);
  append_vec(m_comp_data, &m_crn_header, sizeof(m_crn_header));
  // tack on the rest of the variable size m_level_ofs array
  m_comp_data.resize(m_comp_data.size() + sizeof(m_crn_header.m_level_ofs[0]) * (m_pParams->m_levels - 1));

  if (m_packed_color_endpoints.size()) {
    m_crn_header.m_color_endpoints.m_num = static_cast<uint16>(m_color_endpoints.size());
    m_crn_header.m_color_endpoints.m_size = m_packed_color_endpoints.size();
    m_crn_header.m_color_endpoints.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_color_endpoints);
  }

  if (m_packed_color_selectors.size()) {
    m_crn_header.m_color_selectors.m_num = static_cast<uint16>(m_color_selectors.size());
    m_crn_header.m_color_selectors.m_size = m_packed_color_selectors.size();
    m_crn_header.m_color_selectors.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_color_selectors);
  }

  if (m_packed_alpha_endpoints.size()) {
    m_crn_header.m_alpha_endpoints.m_num = static_cast<uint16>(m_alpha_endpoints.size());
    m_crn_header.m_alpha_endpoints.m_size = m_packed_alpha_endpoints.size();
    m_crn_header.m_alpha_endpoints.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_alpha_endpoints);
  }

  if (m_packed_alpha_selectors.size()) {
    m_crn_header.m_alpha_selectors.m_num = static_cast<uint16>(m_alpha_selectors.size());
    m_crn_header.m_alpha_selectors.m_size = m_packed_alpha_selectors.size();
    m_crn_header.m_alpha_selectors.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_alpha_selectors);
  }

  m_crn_header.m_tables_ofs = m_comp_data.size();
  m_crn_header.m_tables_size = m_packed_data_models.size();
  append_vec(m_comp_data, m_packed_data_models);

  uint level_ofs[cCRNMaxLevels];
  for (uint i = 0; i < m_levels.size(); i++) {
    level_ofs[i] = m_comp_data.size();
    append_vec(m_comp_data, m_packed_blocks[i]);
  }

  crnd::crn_header& dst_header = *(crnd::crn_header*)&m_comp_data[0];
  // don't change the m_comp_data vector - or dst_header will be invalidated!

  memcpy(&dst_header, &m_crn_header, sizeof(dst_header));

  for (uint i = 0; i < m_levels.size(); i++)
    dst_header.m_level_ofs[i] = level_ofs[i];

  const uint actual_header_size = sizeof(crnd::crn_header) + sizeof(dst_header.m_level_ofs[0]) * (m_levels.size() - 1);

  dst_header.m_sig = crnd::crn_header::cCRNSigValue;

  dst_header.m_data_size = m_comp_data.size();
  dst_header.m_data_crc16 = crc16(&m_comp_data[actual_header_size], m_comp_data.size() - actual_header_size);

  dst_header.m_header_size = actual_header_size;
  dst_header.m_header_crc16 = crc16(&dst_header.m_data_size, actual_header_size - (uint)((uint8*)&dst_header.m_data_size - (uint8*)&dst_header));

  return true;
}